

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

long capnp::(anonymous_namespace)::checkRoundTripFromFloat<long,double>(double value)

{
  bool bVar1;
  Fault local_100;
  Fault f_2;
  DebugExpression<double> local_f0;
  undefined1 local_e8 [8];
  DebugComparison<double,_double_&> _kjCondition_2;
  long result;
  Fault f_1;
  double *local_a8;
  undefined1 local_a0 [8];
  DebugComparison<double_&,_double> _kjCondition_1;
  Fault local_68;
  Fault f;
  double *local_58;
  undefined1 local_50 [8];
  DebugComparison<double_&,_double> _kjCondition;
  long MAX;
  long MIN;
  double value_local;
  
  _kjCondition.result = true;
  _kjCondition._33_7_ = 0x7fffffffffffff;
  MIN = (long)value;
  local_58 = (double *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(double *)&MIN);
  f.exception = (Exception *)0xc3e0000000000000;
  kj::_::DebugExpression<double&>::operator>=
            ((DebugComparison<double_&,_double> *)local_50,(DebugExpression<double&> *)&local_58,
             (double *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (bVar1) {
    local_a8 = (double *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(double *)&MIN);
    f_1.exception = (Exception *)0x43e0000000000000;
    kj::_::DebugExpression<double&>::operator<=
              ((DebugComparison<double_&,_double> *)local_a0,(DebugExpression<double&> *)&local_a8,
               (double *)&f_1);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
    if (bVar1) {
      _kjCondition_2._32_8_ = (BADTYPE)(double)MIN;
      f_2.exception = (Exception *)(double)(long)_kjCondition_2._32_8_;
      local_f0 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(double *)&f_2);
      kj::_::DebugExpression<double>::operator==
                ((DebugComparison<double,_double_&> *)local_e8,&local_f0,(double *)&MIN);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e8);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<double,double&>&,char_const(&)[39],double&>
                  (&local_100,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x6df,FAILED,"U(result) == value",
                   "_kjCondition,\"Value out-of-range for requested type.\", value",
                   (DebugComparison<double,_double_&> *)local_e8,
                   (char (*) [39])"Value out-of-range for requested type.",(double *)&MIN);
        kj::_::Debug::Fault::~Fault(&local_100);
      }
      value_local = (double)_kjCondition_2._32_8_;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
                ((Fault *)&result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x6db,FAILED,"value <= U(MAX)",
                 "_kjCondition,\"Value out-of-range for requested type.\", value",
                 (DebugComparison<double_&,_double> *)local_a0,
                 (char (*) [39])"Value out-of-range for requested type.",(double *)&MIN);
      value_local = NAN;
      kj::_::Debug::Fault::~Fault((Fault *)&result);
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x6d8,FAILED,"value >= U(MIN)",
               "_kjCondition,\"Value out-of-range for requested type.\", value",
               (DebugComparison<double_&,_double> *)local_50,
               (char (*) [39])"Value out-of-range for requested type.",(double *)&MIN);
    value_local = -0.0;
    kj::_::Debug::Fault::~Fault(&local_68);
  }
  return (long)value_local;
}

Assistant:

T checkRoundTripFromFloat(U value) {
  // When `U` is `float` or `double`, we have to use a different approach, because casting an
  // out-of-range float to an integer is, surprisingly, UB.
  constexpr T MIN = kj::minValue;
  constexpr T MAX = kj::maxValue;
  KJ_REQUIRE(value >= U(MIN), "Value out-of-range for requested type.", value) {
    return MIN;
  }
  KJ_REQUIRE(value <= U(MAX), "Value out-of-range for requested type.", value) {
    return MAX;
  }
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}